

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_line_interface.cc
# Opt level: O2

void __thiscall
google::protobuf::compiler::CommandLineInterface::MemoryOutputStream::UpdateMetadata
          (MemoryOutputStream *this,size_t insertion_offset,size_t insertion_length)

{
  GeneratorContextImpl *pGVar1;
  void *pvVar2;
  bool bVar3;
  bool bVar4;
  iterator iVar5;
  ostream *poVar6;
  int i;
  long lVar7;
  _Base_ptr data;
  GeneratedCodeInfo metadata;
  GeneratedCodeInfo local_60;
  
  pGVar1 = this->directory_;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_60,
                 &this->filename_,".meta");
  iVar5 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(pGVar1->files_)._M_t,(key_type *)&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  if ((_Rb_tree_header *)iVar5._M_node !=
      &(this->directory_->files_)._M_t._M_impl.super__Rb_tree_header) {
    data = iVar5._M_node + 2;
    GeneratedCodeInfo::GeneratedCodeInfo(&local_60);
    bVar3 = MessageLite::ParseFromString((MessageLite *)&local_60,(string *)data);
    if ((bVar3) ||
       (bVar4 = TextFormat::ParseFromString((string *)data,&local_60.super_Message), bVar4)) {
      for (lVar7 = 0; lVar7 < local_60.annotation_.super_RepeatedPtrFieldBase.current_size_;
          lVar7 = lVar7 + 1) {
        pvVar2 = (local_60.annotation_.super_RepeatedPtrFieldBase.rep_)->elements[lVar7];
        if (insertion_offset <= (ulong)(long)*(int *)((long)pvVar2 + 0x38)) {
          *(int *)((long)pvVar2 + 0x38) = *(int *)((long)pvVar2 + 0x38) + (int)insertion_length;
          *(byte *)((long)pvVar2 + 0x10) = *(byte *)((long)pvVar2 + 0x10) | 6;
          *(int *)((long)pvVar2 + 0x3c) = *(int *)((long)pvVar2 + 0x3c) + (int)insertion_length;
        }
      }
      if (bVar3) {
        MessageLite::SerializeToString((MessageLite *)&local_60,(string *)data);
      }
      else {
        TextFormat::PrintToString(&local_60.super_Message,(string *)data);
      }
    }
    else {
      poVar6 = std::operator<<((ostream *)&std::cerr,(string *)&this->filename_);
      poVar6 = std::operator<<(poVar6,".meta: Could not parse metadata as wire or text format.");
      std::endl<char,std::char_traits<char>>(poVar6);
    }
    GeneratedCodeInfo::~GeneratedCodeInfo(&local_60);
    return;
  }
  return;
}

Assistant:

void CommandLineInterface::MemoryOutputStream::UpdateMetadata(
    size_t insertion_offset, size_t insertion_length) {
  auto it = directory_->files_.find(filename_ + ".meta");
  if (it == directory_->files_.end()) {
    // No metadata was recorded for this file.
    return;
  }
  std::string& encoded_data = it->second;
  GeneratedCodeInfo metadata;
  bool is_text_format = false;
  if (!metadata.ParseFromString(encoded_data)) {
    if (!TextFormat::ParseFromString(encoded_data, &metadata)) {
      // The metadata is invalid.
      std::cerr << filename_
                << ".meta: Could not parse metadata as wire or text format."
                << std::endl;
      return;
    }
    // Generators that use the public plugin interface emit text-format
    // metadata (because in the public plugin protocol, file content must be
    // UTF8-encoded strings).
    is_text_format = true;
  }
  for (int i = 0; i < metadata.annotation_size(); ++i) {
    GeneratedCodeInfo::Annotation* annotation = metadata.mutable_annotation(i);
    if (annotation->begin() >= insertion_offset) {
      annotation->set_begin(annotation->begin() + insertion_length);
      annotation->set_end(annotation->end() + insertion_length);
    }
  }
  if (is_text_format) {
    TextFormat::PrintToString(metadata, &encoded_data);
  } else {
    metadata.SerializeToString(&encoded_data);
  }
}